

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DB.cpp
# Opt level: O3

bool __thiscall DB::execSql(DB *this,string *sql)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  MYSQL_RES *pMVar6;
  MYSQL_ROW ppcVar7;
  int iVar8;
  ulong uVar9;
  
  iVar1 = mysql_query(this->mysql,(sql->_M_dataplus)._M_p);
  if (iVar1 == 0) {
    pMVar6 = (MYSQL_RES *)mysql_use_result(this->mysql);
    this->result = pMVar6;
    if (pMVar6 != (MYSQL_RES *)0x0) {
      uVar2 = mysql_num_fields(pMVar6);
      iVar3 = mysql_num_rows(this->mysql);
      if (iVar3 != 0) {
        iVar8 = 0;
        do {
          ppcVar7 = (MYSQL_ROW)mysql_fetch_row(this->result);
          this->row = ppcVar7;
          if (ppcVar7 == (MYSQL_ROW)0x0) break;
          if (uVar2 != 0) {
            uVar9 = 0;
            do {
              pcVar4 = this->row[uVar9];
              if (pcVar4 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107138);
              }
              else {
                sVar5 = strlen(pcVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar4,sVar5);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
          std::ostream::put('8');
          std::ostream::flush();
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar3);
      }
    }
    mysql_free_result(this->result);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"query error ",0xc);
    pcVar4 = (char *)mysql_error(this->mysql);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107138);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  return iVar1 == 0;
}

Assistant:

bool DB::execSql(string sql) {
    if (mysql_query(mysql, sql.c_str())) {
        cout << "query error " << mysql_error(mysql) << endl;
        return false;
    } else {
        result = mysql_use_result(mysql);
        if (result) {
            unsigned int num_fields = mysql_num_fields(result);
            unsigned int num_rows = mysql_num_rows(reinterpret_cast<MYSQL_RES *>(mysql));
            for (int i = 0; i < num_rows; i++) {
                row = mysql_fetch_row(result);
                if (!row) break;
                for (int j = 0; j < num_fields; j++) {
                    cout << row[j] << "\t";
                }
                cout << endl;
            }
        }
        mysql_free_result(result);
    }
    return true;
}